

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_view.h
# Opt level: O0

void __thiscall
bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
::set(packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container> *this,
     size_t begin,size_t end,word_type pattern)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container> *pbVar3;
  word_type wVar4;
  ulong uVar5;
  long in_RCX;
  long in_RDX;
  bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container> *pbVar6;
  size_t in_RSI;
  packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container> *in_RDI;
  size_t p;
  size_t step;
  word_type value;
  size_t rem;
  size_t len;
  size_t bits_per_word;
  size_t fields_per_word;
  size_t in_stack_ffffffffffffff58;
  unsigned_long in_stack_ffffffffffffff60;
  bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container> *local_98;
  ulong begin_00;
  bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container> *local_38;
  
  sVar2 = width(in_RDI);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sVar2;
  sVar2 = width(in_RDI);
  pbVar3 = (bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container> *)
           (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x40)) / auVar1,0) * sVar2);
  sVar2 = width(in_RDI);
  local_38 = (bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container> *)
             ((in_RDX - in_RSI) * sVar2);
  pbVar6 = (bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container> *)
           ((ulong)local_38 % (ulong)pbVar3);
  width(in_RDI);
  ensure_bitsize<unsigned_long,void>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  wVar4 = field_mask(in_RDI);
  sVar2 = width(in_RDI);
  uVar5 = in_RSI * sVar2;
  while (begin_00 = uVar5, sVar2 = width(in_RDI), uVar5 < in_RDX * sVar2) {
    local_98 = pbVar3;
    if (local_38 < pbVar3) {
      local_98 = pbVar6;
    }
    lowbits<unsigned_long,void>(wVar4 * in_RCX,(size_t)local_98);
    bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::set
              (local_98,begin_00,in_RSI,(word_type)in_RDI);
    local_38 = (bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container> *
               )((long)local_38 - (long)local_98);
    uVar5 = (long)&(local_98->_container).
                   super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Deque_impl_data._M_map + begin_00;
  }
  return;
}

Assistant:

void packed_view<C>::set(size_t begin, size_t end, word_type pattern)
        {
            size_t fields_per_word = W / width();
            size_t bits_per_word = fields_per_word * width(); // It's not useless
            size_t len = (end - begin) * width();
            size_t rem = len % bits_per_word;
            
            ensure_bitsize(pattern, width());
            
            word_type value = field_mask() * pattern;
            
            for(size_t step, p = begin * width();
                p < end * width();
                len -= step, p += step)
            {
                step = len < bits_per_word ? rem : bits_per_word;
                
                _bits.set(p, p + step, lowbits(value, step));
            }
        }